

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_int8.h
# Opt level: O2

void ncnn::im2col_sgemm_int8_sse(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  uint uVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  long lVar8;
  void *pvVar9;
  ulong uVar10;
  undefined1 (*pauVar11) [16];
  uint uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  undefined1 (*pauVar20) [16];
  int iVar21;
  undefined1 *puVar22;
  void *pvVar23;
  size_t _elemsize;
  ulong uVar24;
  long lVar25;
  undefined4 *puVar26;
  undefined1 *puVar27;
  undefined4 *puVar28;
  long lVar29;
  undefined4 *puVar30;
  int *piVar31;
  long lVar32;
  ulong *puVar33;
  ulong uVar34;
  undefined4 *puVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  undefined1 local_88 [64];
  size_t local_48;
  void *local_40;
  long local_38;
  
  iVar7 = cpu_support_x86_avx2();
  if (iVar7 != 0) {
    im2col_sgemm_int8_sse_avx2(bottom_im2col,top_blob,kernel,opt);
    return;
  }
  iVar7 = cpu_support_x86_xop();
  if (iVar7 == 0) {
    uVar1 = bottom_im2col->w;
    iVar7 = bottom_im2col->h;
    uVar13 = bottom_im2col->c;
    lVar29 = (long)(int)uVar13;
    iVar2 = top_blob->c;
    local_48 = 0;
    local_88._0_8_ = (void *)0x0;
    local_88._8_4_ = 0;
    local_88._12_4_ = 0;
    local_88._16_8_ = 0;
    local_88._24_4_ = 0;
    local_88._32_8_ = (Allocator *)0x0;
    local_88._40_4_ = 0;
    local_88._44_4_ = 0;
    local_88._48_12_ = SUB1612((undefined1  [16])0x0,4);
    iVar14 = iVar7;
    uVar12 = uVar1;
    if (lVar29 < 4) {
      _elemsize = 1;
      iVar21 = 1;
      uVar16 = uVar13;
      if (1 < (int)uVar1) {
        iVar14 = iVar7 * 2;
        uVar12 = (uVar1 & 1) + (uVar1 >> 1);
      }
    }
    else {
      _elemsize = 4;
      if ((int)uVar1 < 2) {
        uVar16 = (uVar13 & 3) + (uVar13 >> 2);
      }
      else {
        uVar16 = (uVar13 & 3) + (uVar13 >> 2);
        iVar14 = iVar7 * 2;
        uVar12 = (uVar1 & 1) + (uVar1 >> 1);
      }
      iVar21 = 4;
    }
    Mat::create((Mat *)local_88,iVar14,uVar16,uVar12,_elemsize,iVar21,opt->workspace_allocator);
    uVar15 = 0;
    iVar14 = 0;
    if (0 < iVar7) {
      iVar14 = iVar7;
    }
    uVar24 = (ulong)(int)uVar1;
    uVar18 = (ulong)(uint)((int)uVar1 >> 1);
    if ((int)uVar1 >> 1 < 1) {
      uVar18 = uVar15;
    }
    for (uVar10 = 0; uVar10 != uVar18; uVar10 = uVar10 + 1) {
      puVar27 = (undefined1 *)(local_48 * uVar10 * local_88._16_8_ + local_88._0_8_);
      lVar19 = 1;
      lVar32 = 2;
      lVar17 = 3;
      for (uVar34 = 0; (long)(uVar34 | 3) < lVar29; uVar34 = uVar34 + 4) {
        lVar8 = bottom_im2col->cstep * bottom_im2col->elemsize;
        lVar25 = (long)bottom_im2col->data + uVar15;
        iVar21 = iVar14;
        while (bVar36 = iVar21 != 0, iVar21 = iVar21 + -1, bVar36) {
          *puVar27 = *(undefined1 *)(lVar25 + lVar8 * uVar34);
          puVar27[1] = *(undefined1 *)(lVar25 + lVar8 * lVar19);
          puVar27[2] = *(undefined1 *)(lVar25 + lVar8 * lVar32);
          puVar27[3] = *(undefined1 *)(lVar25 + lVar8 * lVar17);
          puVar27[4] = *(undefined1 *)(lVar25 + 1 + lVar8 * uVar34);
          puVar27[5] = *(undefined1 *)(lVar25 + 1 + lVar8 * lVar19);
          puVar27[6] = *(undefined1 *)(lVar25 + 1 + lVar8 * lVar32);
          puVar27[7] = *(undefined1 *)(lVar25 + 1 + lVar8 * lVar17);
          puVar27 = puVar27 + 8;
          lVar25 = lVar25 + uVar24;
        }
        lVar17 = lVar17 + 4;
        lVar32 = lVar32 + 4;
        lVar19 = lVar19 + 4;
      }
      for (; (long)uVar34 < lVar29; uVar34 = uVar34 + 1) {
        pvVar9 = (void *)(bottom_im2col->cstep * bottom_im2col->elemsize * uVar34 +
                         (long)bottom_im2col->data);
        iVar21 = iVar14;
        while (bVar36 = iVar21 != 0, iVar21 = iVar21 + -1, bVar36) {
          *puVar27 = *(undefined1 *)((long)pvVar9 + uVar15);
          puVar27[1] = *(undefined1 *)((long)pvVar9 + uVar15 + 1);
          puVar27 = puVar27 + 2;
          pvVar9 = (void *)((long)pvVar9 + uVar24);
        }
      }
      uVar15 = uVar15 + 2;
    }
    for (uVar15 = uVar24 & 0xfffffffffffffffe; (long)uVar15 < (long)uVar24; uVar15 = uVar15 + 1) {
      uVar18 = (ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar15 & 0xffffffff;
      puVar27 = (undefined1 *)
                ((long)((int)((long)uVar18 % 2) + (int)((long)uVar18 / 2)) * local_48 *
                 local_88._16_8_ + local_88._0_8_);
      lVar19 = 1;
      lVar32 = 2;
      lVar17 = 3;
      for (uVar18 = 0; (long)(uVar18 | 3) < lVar29; uVar18 = uVar18 + 4) {
        lVar8 = bottom_im2col->cstep * bottom_im2col->elemsize;
        lVar25 = (long)bottom_im2col->data + uVar15;
        iVar21 = iVar14;
        while (bVar36 = iVar21 != 0, iVar21 = iVar21 + -1, bVar36) {
          *puVar27 = *(undefined1 *)(lVar25 + lVar8 * uVar18);
          puVar27[1] = *(undefined1 *)(lVar25 + lVar8 * lVar19);
          puVar27[2] = *(undefined1 *)(lVar25 + lVar8 * lVar32);
          puVar27[3] = *(undefined1 *)(lVar25 + lVar8 * lVar17);
          puVar27 = puVar27 + 4;
          lVar25 = lVar25 + uVar24;
        }
        lVar17 = lVar17 + 4;
        lVar32 = lVar32 + 4;
        lVar19 = lVar19 + 4;
      }
      for (; (long)uVar18 < lVar29; uVar18 = uVar18 + 1) {
        puVar22 = (undefined1 *)
                  ((long)bottom_im2col->data +
                  uVar15 + bottom_im2col->cstep * uVar18 * bottom_im2col->elemsize);
        iVar21 = iVar14;
        while (bVar36 = iVar21 != 0, iVar21 = iVar21 + -1, bVar36) {
          *puVar27 = *puVar22;
          puVar27 = puVar27 + 1;
          puVar22 = puVar22 + uVar24;
        }
      }
    }
    pvVar9 = top_blob->data;
    lVar29 = top_blob->cstep * top_blob->elemsize;
    uVar12 = ((int)uVar13 / 4) * iVar7;
    iVar7 = ((int)uVar13 % 4) * iVar7;
    uVar15 = 0;
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    uVar18 = (ulong)(uint)(iVar2 >> 2);
    if (iVar2 >> 2 < 1) {
      uVar18 = uVar15;
    }
    for (; uVar15 != uVar18; uVar15 = uVar15 + 1) {
      puVar26 = (undefined4 *)(uVar15 * 4 * lVar29 + (long)pvVar9);
      puVar28 = (undefined4 *)((uVar15 * 4 + 1) * lVar29 + (long)pvVar9);
      puVar35 = (undefined4 *)((uVar15 * 4 + 2) * lVar29 + (long)pvVar9);
      puVar30 = (undefined4 *)((uVar15 * 4 + 3) * lVar29 + (long)pvVar9);
      pauVar11 = (undefined1 (*) [16])
                 (kernel->cstep * uVar15 * kernel->elemsize + (long)kernel->data);
      for (uVar10 = 0; (long)(uVar10 | 1) < (long)uVar24; uVar10 = uVar10 + 2) {
        puVar33 = (ulong *)((uVar10 >> 1) * local_48 * local_88._16_8_ + local_88._0_8_);
        auVar38 = ZEXT1664((undefined1  [16])0x0);
        auVar40 = ZEXT1664((undefined1  [16])0x0);
        pauVar20 = pauVar11;
        if (0 < (int)uVar12) {
          auVar43 = ZEXT1664((undefined1  [16])0x0);
          auVar45 = ZEXT1664((undefined1  [16])0x0);
          uVar13 = uVar12;
          while( true ) {
            bVar36 = uVar13 == 0;
            uVar13 = uVar13 - 1;
            if (bVar36) break;
            auVar39._8_8_ = 0;
            auVar39._0_8_ = *puVar33;
            auVar41 = vpmovsxbw_avx(auVar39);
            auVar37 = *pauVar20;
            auVar39 = vpcmpgtb_avx((undefined1  [16])0x0,auVar37);
            auVar5 = vpunpcklbw_avx(auVar37,auVar39);
            auVar44 = vpunpckhbw_avx(auVar37,auVar39);
            auVar39 = vpshufd_avx(auVar41,0x44);
            auVar37 = vpmaddwd_avx(auVar5,auVar39);
            auVar37 = vpaddd_avx(auVar37,auVar45._0_16_);
            auVar45 = ZEXT1664(auVar37);
            auVar37 = vpmaddwd_avx(auVar39,auVar44);
            auVar37 = vpaddd_avx(auVar37,auVar40._0_16_);
            auVar40 = ZEXT1664(auVar37);
            auVar39 = vpshufd_avx(auVar41,0xee);
            auVar37 = vpmaddwd_avx(auVar5,auVar39);
            auVar37 = vpaddd_avx(auVar37,auVar43._0_16_);
            auVar43 = ZEXT1664(auVar37);
            auVar37 = vpmaddwd_avx(auVar39,auVar44);
            auVar37 = vpaddd_avx(auVar37,auVar38._0_16_);
            auVar38 = ZEXT1664(auVar37);
            puVar33 = puVar33 + 1;
            pauVar20 = pauVar20 + 1;
          }
          auVar37 = vphaddd_avx(auVar45._0_16_,auVar40._0_16_);
          auVar40 = ZEXT1664(auVar37);
          auVar37 = vphaddd_avx(auVar43._0_16_,auVar38._0_16_);
          auVar38 = ZEXT1664(auVar37);
        }
        lVar19 = 0;
        while( true ) {
          if (iVar7 == (int)lVar19) break;
          auVar37 = vpmovsxbw_avx(ZEXT216(*(ushort *)((long)puVar33 + lVar19 * 2)));
          auVar37 = vpshuflw_avx(auVar37,0x50);
          auVar39 = vpshufd_avx(auVar37,0x50);
          auVar37._8_8_ = 0;
          auVar37._0_8_ = *(ulong *)(*pauVar20 + lVar19 * 4);
          auVar37 = vpmovsxbw_avx(auVar37);
          auVar37 = vpshufd_avx(auVar37,0x44);
          auVar41 = vpmullw_avx(auVar39,auVar37);
          auVar39 = vpmulhw_avx(auVar39,auVar37);
          auVar37 = vpunpcklwd_avx(auVar41,auVar39);
          auVar37 = vpaddd_avx(auVar40._0_16_,auVar37);
          auVar40 = ZEXT1664(auVar37);
          auVar37 = vpunpckhwd_avx(auVar41,auVar39);
          auVar37 = vpaddd_avx(auVar38._0_16_,auVar37);
          auVar38 = ZEXT1664(auVar37);
          lVar19 = lVar19 + 1;
        }
        *puVar26 = auVar40._0_4_;
        *puVar28 = auVar40._4_4_;
        *puVar35 = auVar40._8_4_;
        *puVar30 = auVar40._12_4_;
        puVar26[1] = auVar38._0_4_;
        puVar28[1] = auVar38._4_4_;
        puVar35[1] = auVar38._8_4_;
        puVar30[1] = auVar38._12_4_;
        puVar26 = puVar26 + 2;
        puVar28 = puVar28 + 2;
        puVar35 = puVar35 + 2;
        puVar30 = puVar30 + 2;
      }
      pauVar11 = (undefined1 (*) [16])
                 (kernel->cstep * uVar15 * kernel->elemsize + (long)kernel->data);
      while (uVar13 = (uint)uVar10, (int)uVar13 < (int)uVar1) {
        puVar33 = (ulong *)((ulong)((uVar13 & 1) + ((uint)(uVar10 >> 1) & 0x7fffffff)) *
                            local_48 * local_88._16_8_ + local_88._0_8_);
        auVar38 = ZEXT1664((undefined1  [16])0x0);
        pauVar20 = pauVar11;
        if (0 < (int)uVar12) {
          auVar40 = ZEXT1664((undefined1  [16])0x0);
          auVar43 = ZEXT1664((undefined1  [16])0x0);
          auVar45 = ZEXT1664((undefined1  [16])0x0);
          uVar16 = uVar12;
          while( true ) {
            bVar36 = uVar16 == 0;
            uVar16 = uVar16 - 1;
            auVar37 = auVar38._0_16_;
            auVar39 = auVar40._0_16_;
            auVar41 = auVar43._0_16_;
            auVar44 = auVar45._0_16_;
            if (bVar36) break;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = *puVar33;
            auVar3 = vpmovsxbw_avx(auVar5);
            auVar5 = *pauVar20;
            auVar42 = vpcmpgtb_avx((undefined1  [16])0x0,auVar5);
            auVar6 = vpunpcklbw_avx(auVar5,auVar42);
            auVar4 = vpunpckhbw_avx(auVar5,auVar42);
            auVar42 = vpshufd_avx(auVar3,0x44);
            auVar3 = vpmullw_avx(auVar6,auVar42);
            auVar5 = vpmulhw_avx(auVar6,auVar42);
            auVar6 = vpmullw_avx(auVar42,auVar4);
            auVar42 = vpmulhw_avx(auVar42,auVar4);
            auVar4 = vpunpcklwd_avx(auVar3,auVar5);
            auVar37 = vpaddd_avx(auVar37,auVar4);
            auVar38 = ZEXT1664(auVar37);
            auVar37 = vpunpckhwd_avx(auVar3,auVar5);
            auVar37 = vpaddd_avx(auVar39,auVar37);
            auVar40 = ZEXT1664(auVar37);
            auVar37 = vpunpcklwd_avx(auVar6,auVar42);
            auVar37 = vpaddd_avx(auVar41,auVar37);
            auVar43 = ZEXT1664(auVar37);
            auVar37 = vpunpckhwd_avx(auVar6,auVar42);
            auVar37 = vpaddd_avx(auVar44,auVar37);
            auVar45 = ZEXT1664(auVar37);
            puVar33 = (ulong *)((long)puVar33 + 4);
            pauVar20 = pauVar20 + 1;
          }
          auVar5 = vpunpckldq_avx(auVar37,auVar39);
          auVar42 = vpunpckldq_avx(auVar41,auVar44);
          auVar39 = vpunpckhdq_avx(auVar37,auVar39);
          auVar41 = vpunpckhdq_avx(auVar41,auVar44);
          auVar44 = vpunpcklqdq_avx(auVar5,auVar42);
          auVar37 = vpunpckhqdq_avx(auVar5,auVar42);
          auVar37 = vpaddd_avx(auVar44,auVar37);
          auVar44 = vpunpcklqdq_avx(auVar39,auVar41);
          auVar39 = vpunpckhqdq_avx(auVar39,auVar41);
          auVar39 = vpaddd_avx(auVar39,auVar44);
          auVar37 = vpaddd_avx(auVar37,auVar39);
          auVar38 = ZEXT1664(auVar37);
        }
        for (lVar19 = 0; iVar7 != (int)lVar19; lVar19 = lVar19 + 1) {
          auVar37 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)puVar33 + lVar19)),0);
          auVar44 = vpshufd_avx(auVar37,0);
          auVar41._8_8_ = 0;
          auVar41._0_8_ = *(ulong *)(*pauVar20 + lVar19 * 4);
          auVar37 = vpmovsxbw_avx(auVar41);
          auVar39 = vpmullw_avx(auVar44,auVar37);
          auVar37 = vpmulhw_avx(auVar44,auVar37);
          auVar37 = vpunpcklwd_avx(auVar39,auVar37);
          auVar37 = vpaddd_avx(auVar38._0_16_,auVar37);
          auVar38 = ZEXT1664(auVar37);
        }
        *puVar26 = auVar38._0_4_;
        *puVar28 = auVar38._4_4_;
        *puVar35 = auVar38._8_4_;
        *puVar30 = auVar38._12_4_;
        puVar26 = puVar26 + 1;
        puVar28 = puVar28 + 1;
        puVar35 = puVar35 + 1;
        puVar30 = puVar30 + 1;
        uVar10 = (ulong)(uVar13 + 1);
      }
    }
    local_38 = top_blob->cstep * top_blob->elemsize;
    local_40 = top_blob->data;
    for (uVar15 = (long)iVar2 & 0xfffffffffffffffc; (long)uVar15 < (long)iVar2; uVar15 = uVar15 + 1)
    {
      uVar18 = (ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar15 & 0xffffffff;
      piVar31 = (int *)(local_38 * uVar15 + (long)local_40);
      lVar29 = (long)((int)((long)uVar18 % 4) + (int)((long)uVar18 / 4));
      pvVar9 = (void *)(kernel->cstep * lVar29 * kernel->elemsize + (long)kernel->data);
      for (uVar18 = 0; (long)(uVar18 | 1) < (long)uVar24; uVar18 = uVar18 + 2) {
        puVar33 = (ulong *)((uVar18 >> 1) * local_48 * local_88._16_8_ + local_88._0_8_);
        if ((int)uVar12 < 1) {
          iVar14 = 0;
          iVar21 = 0;
          pvVar23 = pvVar9;
        }
        else {
          auVar38 = ZEXT1664((undefined1  [16])0x0);
          lVar19 = 0;
          auVar40 = ZEXT1664((undefined1  [16])0x0);
          while( true ) {
            auVar37 = auVar38._0_16_;
            auVar39 = auVar40._0_16_;
            if (uVar12 == (uint)lVar19) break;
            auVar42._8_8_ = 0;
            auVar42._0_8_ = *puVar33;
            auVar41 = vpcmpgtb_avx((undefined1  [16])0x0,auVar42);
            auVar5 = vpunpcklbw_avx(auVar42,auVar41);
            auVar44._8_8_ = 0;
            auVar44._0_8_ = *(ulong *)((long)pvVar9 + lVar19 * 4);
            auVar41 = vpmovsxbw_avx(auVar44);
            auVar41 = vpshufd_avx(auVar41,0x44);
            auVar44 = vpmullw_avx(auVar41,auVar5);
            auVar41 = vpmulhw_avx(auVar5,auVar41);
            auVar5 = vpunpcklwd_avx(auVar44,auVar41);
            auVar37 = vpaddd_avx(auVar37,auVar5);
            auVar38 = ZEXT1664(auVar37);
            auVar37 = vpunpckhwd_avx(auVar44,auVar41);
            auVar37 = vpaddd_avx(auVar39,auVar37);
            auVar40 = ZEXT1664(auVar37);
            puVar33 = puVar33 + 1;
            lVar19 = lVar19 + 1;
          }
          auVar37 = vphaddd_avx(auVar37,auVar37);
          auVar37 = vphaddd_avx(auVar37,auVar37);
          auVar39 = vphaddd_avx(auVar39,auVar39);
          auVar39 = vphaddd_avx(auVar39,auVar39);
          iVar14 = auVar37._0_4_;
          iVar21 = auVar39._0_4_;
          pvVar23 = (void *)((ulong)uVar12 * 4 + (long)pvVar9);
        }
        for (lVar19 = 0; iVar7 != (int)lVar19; lVar19 = lVar19 + 1) {
          iVar14 = iVar14 + (int)*(char *)((long)puVar33 + lVar19 * 2) *
                            (int)*(char *)((long)pvVar23 + lVar19);
          iVar21 = iVar21 + (int)*(char *)((long)puVar33 + lVar19 * 2 + 1) *
                            (int)*(char *)((long)pvVar23 + lVar19);
        }
        *piVar31 = iVar14;
        piVar31[1] = iVar21;
        piVar31 = piVar31 + 2;
      }
      pvVar9 = (void *)(lVar29 * kernel->cstep * kernel->elemsize + (long)kernel->data);
      while (uVar13 = (uint)uVar18, (int)uVar13 < (int)uVar1) {
        puVar33 = (ulong *)((ulong)((uVar13 & 1) + ((uint)(uVar18 >> 1) & 0x7fffffff)) *
                            local_48 * local_88._16_8_ + local_88._0_8_);
        if ((int)uVar12 < 1) {
          iVar14 = 0;
          pvVar23 = pvVar9;
        }
        else {
          auVar38 = ZEXT1664((undefined1  [16])0x0);
          for (lVar29 = 0; auVar37 = auVar38._0_16_, uVar12 != (uint)lVar29; lVar29 = lVar29 + 1) {
            auVar3._8_8_ = 0;
            auVar3._0_8_ = *puVar33;
            auVar39 = vpmovsxbw_avx(auVar3);
            auVar6._8_8_ = 0;
            auVar6._0_8_ = *(ulong *)((long)pvVar9 + lVar29 * 4);
            auVar41 = vpmovsxbw_avx(auVar6);
            auVar44 = vpmullw_avx(auVar41,auVar39);
            auVar39 = vpmulhw_avx(auVar39,auVar41);
            auVar39 = vpunpcklwd_avx(auVar44,auVar39);
            auVar37 = vpaddd_avx(auVar37,auVar39);
            auVar38 = ZEXT1664(auVar37);
            puVar33 = (ulong *)((long)puVar33 + 4);
          }
          auVar37 = vphaddd_avx(auVar37,auVar37);
          auVar37 = vphaddd_avx(auVar37,auVar37);
          iVar14 = auVar37._0_4_;
          pvVar23 = (void *)((long)pvVar9 + (ulong)uVar12 * 4);
        }
        for (lVar29 = 0; iVar7 != (int)lVar29; lVar29 = lVar29 + 1) {
          iVar14 = iVar14 + (int)*(char *)((long)pvVar23 + lVar29) *
                            (int)*(char *)((long)puVar33 + lVar29);
        }
        *piVar31 = iVar14;
        piVar31 = piVar31 + 1;
        uVar18 = (ulong)(uVar13 + 1);
      }
    }
    piVar31 = (int *)CONCAT44(local_88._12_4_,local_88._8_4_);
    if (piVar31 != (int *)0x0) {
      LOCK();
      *piVar31 = *piVar31 + -1;
      UNLOCK();
      if (*piVar31 == 0) {
        if ((Allocator *)local_88._32_8_ == (Allocator *)0x0) {
          free((void *)local_88._0_8_);
        }
        else {
          (*(*(_func_int ***)local_88._32_8_)[3])();
        }
      }
    }
    return;
  }
  im2col_sgemm_int8_sse_xop(bottom_im2col,top_blob,kernel,opt);
  return;
}

Assistant:

static void im2col_sgemm_int8_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        im2col_sgemm_int8_sse_avx512vnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        im2col_sgemm_int8_sse_avxvnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        im2col_sgemm_int8_sse_avx2(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        im2col_sgemm_int8_sse_xop(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif
#endif

    // Mat bottom_im2col(size, maxk, inch, 8u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    // permute
    Mat tmp;
#if __SSE2__
    if (inch >= 4)
    {
#if __AVX2__
        if (size >= 4)
            tmp.create(4 * maxk, inch / 4 + inch % 4, size / 4 + (size % 4) / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else if (size >= 2)
            tmp.create(2 * maxk, inch / 4 + inch % 4, size / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else
            tmp.create(maxk, inch / 4 + inch % 4, size, 4u, 4, opt.workspace_allocator);
#else
        if (size >= 2)
            tmp.create(2 * maxk, inch / 4 + inch % 4, size / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else
            tmp.create(maxk, inch / 4 + inch % 4, size, 4u, 4, opt.workspace_allocator);
#endif
    }
    else
    {
#if __AVX2__
        if (size >= 4)
            tmp.create(4 * maxk, inch, size / 4 + (size % 4) / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else if (size >= 2)
            tmp.create(2 * maxk, inch, size / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else
            tmp.create(maxk, inch, size, 1u, 1, opt.workspace_allocator);
#else
        if (size >= 2)
            tmp.create(2 * maxk, inch, size / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else
            tmp.create(maxk, inch, size, 1u, 1, opt.workspace_allocator);
#endif
    }
    {
#if __AVX2__
        int remain_size_start = 0;
        int nn_size = size >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            signed char* tmpptr = tmp.channel(i / 4);

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr[4] = img0[1];
                    tmpptr[5] = img1[1];
                    tmpptr[6] = img2[1];
                    tmpptr[7] = img3[1];
                    tmpptr[8] = img0[2];
                    tmpptr[9] = img1[2];
                    tmpptr[10] = img2[2];
                    tmpptr[11] = img3[2];
                    tmpptr[12] = img0[3];
                    tmpptr[13] = img1[3];
                    tmpptr[14] = img2[3];
                    tmpptr[15] = img3[3];
                    tmpptr += 16;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img0[1];
                    tmpptr[2] = img0[2];
                    tmpptr[3] = img0[3];

                    tmpptr += 4;

                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;
#else
        int remain_size_start = 0;
        int nn_size = (size - remain_size_start) >> 1;
#endif

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

#if __AVX2__
            signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            signed char* tmpptr = tmp.channel(i / 2);
#endif

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr[4] = img0[1];
                    tmpptr[5] = img1[1];
                    tmpptr[6] = img2[1];
                    tmpptr[7] = img3[1];
                    tmpptr += 8;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img0[1];

                    tmpptr += 2;

                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
#if __AVX2__
            signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr += 4;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];

                    tmpptr += 1;

                    img0 += size;
                }
            }
        }
    }
#else // __SSE2__
    tmp.create(maxk, inch, size, 1u, 1, opt.workspace_allocator);
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
        {
            signed char* tmpptr = tmp.channel(i);

            int q = 0;
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];

                    tmpptr += 1;

                    img0 += size;
                }
            }
        }
    }
#endif // __SSE2__

    int nn_outch = 0;
    int remain_outch_start = 0;

#if __SSE2__
    nn_outch = outch >> 2;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 4;

        int* outptr0 = top_blob.channel(p);
        int* outptr1 = top_blob.channel(p + 1);
        int* outptr2 = top_blob.channel(p + 2);
        int* outptr3 = top_blob.channel(p + 3);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            __m256i _sum00_12 = _mm256_setzero_si256();
            __m256i _sum20_32 = _mm256_setzero_si256();

            if (nn4 > 0)
            {
                __m256i _sum10_02 = _mm256_setzero_si256();
                __m256i _sum30_22 = _mm256_setzero_si256();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val0123 = _mm_loadu_si128((const __m128i*)tmpptr);
                    __m256i _val0123_16 = _mm256_cvtepi8_epi16(_val0123);

                    __m256i _val01_16 = _mm256_permute4x64_epi64(_val0123_16, _MM_SHUFFLE(1, 1, 0, 0));
                    __m256i _val23_16 = _mm256_permute4x64_epi64(_val0123_16, _MM_SHUFFLE(3, 3, 2, 2));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);

                    __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);
                    __m256i _val32_16 = _mm256_permute4x64_epi64(_val23_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                    _sum00_12 = _mm256_dpwssd_epi32(_sum00_12, _val01_16, _w01_16);
                    _sum10_02 = _mm256_dpwssd_epi32(_sum10_02, _val10_16, _w01_16);
                    _sum20_32 = _mm256_dpwssd_epi32(_sum20_32, _val23_16, _w01_16);
                    _sum30_22 = _mm256_dpwssd_epi32(_sum30_22, _val32_16, _w01_16);
#else
                    _sum00_12 = _mm256_add_epi32(_sum00_12, _mm256_madd_epi16(_val01_16, _w01_16));
                    _sum10_02 = _mm256_add_epi32(_sum10_02, _mm256_madd_epi16(_val10_16, _w01_16));
                    _sum20_32 = _mm256_add_epi32(_sum20_32, _mm256_madd_epi16(_val23_16, _w01_16));
                    _sum30_22 = _mm256_add_epi32(_sum30_22, _mm256_madd_epi16(_val32_16, _w01_16));
#endif

                    tmpptr += 16;
                    kptr0 += 16;
                }

                _sum00_12 = _mm256_hadd_epi32(_sum00_12, _sum10_02);
                _sum20_32 = _mm256_hadd_epi32(_sum20_32, _sum30_22);

                _sum00_12 = _mm256_permute4x64_epi64(_sum00_12, _MM_SHUFFLE(2, 1, 3, 0));
                _sum20_32 = _mm256_permute4x64_epi64(_sum20_32, _MM_SHUFFLE(2, 1, 3, 0));
            }

            __m128i _sum00 = _mm256_extracti128_si256(_sum00_12, 0);
            __m128i _sum10 = _mm256_extracti128_si256(_sum00_12, 1);
            __m128i _sum20 = _mm256_extracti128_si256(_sum20_32, 0);
            __m128i _sum30 = _mm256_extracti128_si256(_sum20_32, 1);

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val0123 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                _val0123 = _mm_cvtepi8_epi16(_val0123);
#else
                __m128i _extval0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val0123);
                _val0123 = _mm_unpacklo_epi8(_val0123, _extval0123);
#endif

                __m128i _val01 = _mm_shufflelo_epi16(_val0123, _MM_SHUFFLE(1, 1, 0, 0));

                _val01 = _mm_shuffle_epi32(_val01, _MM_SHUFFLE(1, 1, 0, 0));

                __m128i _val23 = _mm_shufflelo_epi16(_val0123, _MM_SHUFFLE(3, 3, 2, 2));

                _val23 = _mm_shuffle_epi32(_val23, _MM_SHUFFLE(1, 1, 0, 0));

                __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                _w0123 = _mm_cvtepi8_epi16(_w0123);
#else
                __m128i _extw0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                _w0123 = _mm_unpacklo_epi8(_w0123, _extw0123);
#endif

                _w0123 = _mm_shuffle_epi32(_w0123, _MM_SHUFFLE(1, 0, 1, 0));

                __m128i _sl00 = _mm_mullo_epi16(_val01, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val01, _w0123);
                __m128i _sl10 = _mm_mullo_epi16(_val23, _w0123);
                __m128i _sh10 = _mm_mulhi_epi16(_val23, _w0123);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl00, _sh00));
                _sum20 = _mm_add_epi32(_sum20, _mm_unpacklo_epi16(_sl10, _sh10));
                _sum30 = _mm_add_epi32(_sum30, _mm_unpackhi_epi16(_sl10, _sh10));

                tmpptr += 4;
                kptr0 += 4;
            }

            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum00, _sum10);
                _tmp1 = _mm_unpacklo_epi32(_sum20, _sum30);
                _tmp2 = _mm_unpackhi_epi32(_sum00, _sum10);
                _tmp3 = _mm_unpackhi_epi32(_sum20, _sum30);
                _sum00 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum10 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum20 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum30 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _mm_storeu_si128((__m128i*)outptr0, _sum00);
            _mm_storeu_si128((__m128i*)outptr1, _sum10);
            _mm_storeu_si128((__m128i*)outptr2, _sum20);
            _mm_storeu_si128((__m128i*)outptr3, _sum30);
            outptr0 += 4;
            outptr1 += 4;
            outptr2 += 4;
            outptr3 += 4;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

#if __AVX2__
            __m256i _sum00_12 = _mm256_setzero_si256();
#else
            __m128i _sum00 = _mm_setzero_si128();
            __m128i _sum10 = _mm_setzero_si128();
#endif

            if (nn4 > 0)
            {
#if __AVX2__
                __m256i _sum10_02 = _mm256_setzero_si256();
#else
                __m128i _sum01 = _mm_setzero_si128();
                __m128i _sum11 = _mm_setzero_si128();
#endif

                int j = 0;
                for (; j < nn4; j++)
                {
#if __AVX2__
                    __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                    __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                    _val01_16 = _mm256_permute4x64_epi64(_val01_16, _MM_SHUFFLE(1, 1, 0, 0));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);

                    __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                    _sum00_12 = _mm256_dpwssd_epi32(_sum00_12, _val01_16, _w01_16);
                    _sum10_02 = _mm256_dpwssd_epi32(_sum10_02, _val10_16, _w01_16);
#else
                    _sum00_12 = _mm256_add_epi32(_sum00_12, _mm256_madd_epi16(_val01_16, _w01_16));
                    _sum10_02 = _mm256_add_epi32(_sum10_02, _mm256_madd_epi16(_val10_16, _w01_16));
#endif
#else
                    __m128i _val01 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                    _val01 = _mm_cvtepi8_epi16(_val01);
#else
                    __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                    _val01 = _mm_unpacklo_epi8(_val01, _extval01);
#endif

                    __m128i _val0 = _mm_shuffle_epi32(_val01, _MM_SHUFFLE(1, 0, 1, 0));
                    __m128i _val1 = _mm_shuffle_epi32(_val01, _MM_SHUFFLE(3, 2, 3, 2));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                    __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                    __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);

#if __XOP__
                    _sum00 = _mm_maddd_epi16(_val0, _w0, _sum00);
                    _sum01 = _mm_maddd_epi16(_val0, _w1, _sum01);
                    _sum10 = _mm_maddd_epi16(_val1, _w0, _sum10);
                    _sum11 = _mm_maddd_epi16(_val1, _w1, _sum11);
#else
                    _sum00 = _mm_add_epi32(_mm_madd_epi16(_val0, _w0), _sum00);
                    _sum01 = _mm_add_epi32(_mm_madd_epi16(_val0, _w1), _sum01);
                    _sum10 = _mm_add_epi32(_mm_madd_epi16(_val1, _w0), _sum10);
                    _sum11 = _mm_add_epi32(_mm_madd_epi16(_val1, _w1), _sum11);
#endif
#endif

                    tmpptr += 8;
                    kptr0 += 16;
                }

#if __AVX2__
                _sum00_12 = _mm256_hadd_epi32(_sum00_12, _sum10_02);

                _sum00_12 = _mm256_permute4x64_epi64(_sum00_12, _MM_SHUFFLE(2, 1, 3, 0));
#else
#if __SSSE3__
                _sum00 = _mm_hadd_epi32(_sum00, _sum01);
                _sum10 = _mm_hadd_epi32(_sum10, _sum11);
#else
                __m128i _sum00_sh = _mm_shuffle_epi32(_sum00, 216);
                __m128i _sum01_sh = _mm_shuffle_epi32(_sum01, 216);
                __m128i _sum10_sh = _mm_shuffle_epi32(_sum10, 216);
                __m128i _sum11_sh = _mm_shuffle_epi32(_sum11, 216);

                _sum00 = _mm_unpacklo_epi64(_sum00_sh, _sum01_sh);
                _sum01 = _mm_unpackhi_epi64(_sum00_sh, _sum01_sh);
                _sum10 = _mm_unpacklo_epi64(_sum10_sh, _sum11_sh);
                _sum11 = _mm_unpackhi_epi64(_sum10_sh, _sum11_sh);

                _sum00 = _mm_add_epi32(_sum00, _sum01);
                _sum10 = _mm_add_epi32(_sum10, _sum11);
#endif
#endif
            }

#if __AVX2__
            __m128i _sum00 = _mm256_extracti128_si256(_sum00_12, 0);
            __m128i _sum10 = _mm256_extracti128_si256(_sum00_12, 1);
#endif

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val = _mm_set_epi16(tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[0], tmpptr[0], tmpptr[0], tmpptr[0]);

                // https://gcc.gnu.org/bugzilla/show_bug.cgi?id=99754
                // gcc incorrectly put 32bit to tail with _mm_loadu_si32  :(
                // 0 1 2 3 x x x x x x x x x x x x
                // x x x x x x x x x x x x 0 1 2 3
                // __m128i _w0123 = _mm_loadu_si32(kptr0);
                __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                _w0123 = _mm_cvtepi8_epi16(_w0123);
#else
                __m128i _extw0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                _w0123 = _mm_unpacklo_epi8(_w0123, _extw0123);
#endif

                _w0123 = _mm_shuffle_epi32(_w0123, _MM_SHUFFLE(1, 0, 1, 0));

                __m128i _sl00 = _mm_mullo_epi16(_val, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val, _w0123);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl00, _sh00));

                tmpptr += 2;
                kptr0 += 4;
            }

            int sum[8];
            _mm_storeu_si128((__m128i*)sum, _sum00);
            _mm_storeu_si128((__m128i*)(sum + 4), _sum10);

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0[1] = sum[4];
            outptr1[1] = sum[5];
            outptr2[1] = sum[6];
            outptr3[1] = sum[7];
            outptr0 += 2;
            outptr1 += 2;
            outptr2 += 2;
            outptr3 += 2;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            __m128i _sum0 = _mm_setzero_si128();

            if (nn4 > 0)
            {
                __m128i _sum1 = _mm_setzero_si128();
                __m128i _sum2 = _mm_setzero_si128();
                __m128i _sum3 = _mm_setzero_si128();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val01 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                    __m128i _val0 = _mm_cvtepi8_epi16(_val01);
#else
                    __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                    __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
#endif

                    _val0 = _mm_shuffle_epi32(_val0, _MM_SHUFFLE(1, 0, 1, 0));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                    __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                    __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);

                    __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                    __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);
                    __m128i _sl01 = _mm_mullo_epi16(_val0, _w1);
                    __m128i _sh01 = _mm_mulhi_epi16(_val0, _w1);

                    _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl00, _sh00));
                    _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl00, _sh00));
                    _sum2 = _mm_add_epi32(_sum2, _mm_unpacklo_epi16(_sl01, _sh01));
                    _sum3 = _mm_add_epi32(_sum3, _mm_unpackhi_epi16(_sl01, _sh01));

                    tmpptr += 4;
                    kptr0 += 16;
                }

                // transpose 4x4
                {
                    __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                    _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                    _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                    _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                    _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                    _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                    _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                    _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
                }

                _sum0 = _mm_add_epi32(_sum0, _sum1);
                _sum2 = _mm_add_epi32(_sum2, _sum3);
                _sum0 = _mm_add_epi32(_sum0, _sum2);
            }

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val = _mm_set1_epi16(tmpptr[0]);

                __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                _w0123 = _mm_cvtepi8_epi16(_w0123);
#else
                __m128i _extw0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                _w0123 = _mm_unpacklo_epi8(_w0123, _extw0123);
#endif

                __m128i _sl00 = _mm_mullo_epi16(_val, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val, _w0123);

                _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl00, _sh00));

                tmpptr += 1;
                kptr0 += 4;
            }

            int sum[4];
            _mm_storeu_si128((__m128i*)sum, _sum0);

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0 += 1;
            outptr1 += 1;
            outptr2 += 1;
            outptr3 += 1;
        }
    }

    remain_outch_start += nn_outch << 2;
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        int* outptr0 = top_blob.channel(p);

        int i = 0;
#if __SSE2__
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            int sum0 = 0;
            int sum1 = 0;
            int sum2 = 0;
            int sum3 = 0;

            if (nn4 > 0)
            {
                __m256i _sum0_2 = _mm256_setzero_si256();
                __m256i _sum1_3 = _mm256_setzero_si256();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                    __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                    __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
                    __m128i _w = _mm_cvtepi8_epi16(_w0123);
                    _w = _mm_unpacklo_epi64(_w, _w);
                    __m256i _ww = _mm256_inserti128_si256(_mm256_castsi128_si256(_w), _w, 1);

                    __m256i _sl0_1 = _mm256_mullo_epi16(_val01_16, _ww);
                    __m256i _sh0_1 = _mm256_mulhi_epi16(_val01_16, _ww);

                    _sum0_2 = _mm256_add_epi32(_sum0_2, _mm256_unpacklo_epi16(_sl0_1, _sh0_1));
                    _sum1_3 = _mm256_add_epi32(_sum1_3, _mm256_unpackhi_epi16(_sl0_1, _sh0_1));

                    tmpptr += 16;
                    kptr0 += 4;
                }

                __m128i _sum0 = _mm256_extracti128_si256(_sum0_2, 0);
                __m128i _sum1 = _mm256_extracti128_si256(_sum1_3, 0);
                __m128i _sum2 = _mm256_extracti128_si256(_sum0_2, 1);
                __m128i _sum3 = _mm256_extracti128_si256(_sum1_3, 1);

                sum0 = _mm_reduce_add_epi32(_sum0);
                sum1 = _mm_reduce_add_epi32(_sum1);
                sum2 = _mm_reduce_add_epi32(_sum2);
                sum3 = _mm_reduce_add_epi32(_sum3);
            }

            int j = 0;
            for (; j < nn1; j++)
            {
                signed char val0 = tmpptr[0];
                signed char val1 = tmpptr[1];
                signed char val2 = tmpptr[2];
                signed char val3 = tmpptr[3];
                signed char w = kptr0[0];

                sum0 += val0 * w;
                sum1 += val1 * w;
                sum2 += val2 * w;
                sum3 += val3 * w;

                tmpptr += 4;
                kptr0 += 1;
            }

            outptr0[0] = sum0;
            outptr0[1] = sum1;
            outptr0[2] = sum2;
            outptr0[3] = sum3;
            outptr0 += 4;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            int sum0 = 0;
            int sum1 = 0;

            if (nn4 > 0)
            {
                __m128i _sum0 = _mm_setzero_si128();
                __m128i _sum1 = _mm_setzero_si128();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
                    __m128i _extval = _mm_cmpgt_epi8(_mm_setzero_si128(), _val);
                    __m128i _val01 = _mm_unpacklo_epi8(_val, _extval);

                    __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                    __m128i _w = _mm_cvtepi8_epi16(_w0123);
#else
                    __m128i _extw = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                    __m128i _w = _mm_unpacklo_epi8(_w0123, _extw);
#endif
                    _w = _mm_shuffle_epi32(_w, _MM_SHUFFLE(1, 0, 1, 0));

                    __m128i _sl01 = _mm_mullo_epi16(_val01, _w);
                    __m128i _sh01 = _mm_mulhi_epi16(_val01, _w);

                    _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl01, _sh01));
                    _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl01, _sh01));

                    tmpptr += 8;
                    kptr0 += 4;
                }

                sum0 = _mm_reduce_add_epi32(_sum0);
                sum1 = _mm_reduce_add_epi32(_sum1);
            }

            int j = 0;
            for (; j < nn1; j++)
            {
                signed char val0 = tmpptr[0];
                signed char val1 = tmpptr[1];
                signed char w = kptr0[0];

                sum0 += val0 * w;
                sum1 += val1 * w;

                tmpptr += 2;
                kptr0 += 1;
            }

            outptr0[0] = sum0;
            outptr0[1] = sum1;
            outptr0 += 2;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            int sum = 0;

            if (nn4 > 0)
            {
                __m128i _sum = _mm_setzero_si128();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val0123 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                    __m128i _val = _mm_cvtepi8_epi16(_val0123);
#else
                    __m128i _extval = _mm_cmpgt_epi8(_mm_setzero_si128(), _val0123);
                    __m128i _val = _mm_unpacklo_epi8(_val0123, _extval);
#endif

                    __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                    __m128i _w = _mm_cvtepi8_epi16(_w0123);
#else
                    __m128i _extw = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                    __m128i _w = _mm_unpacklo_epi8(_w0123, _extw);
#endif

                    __m128i _sl = _mm_mullo_epi16(_val, _w);
                    __m128i _sh = _mm_mulhi_epi16(_val, _w);

                    _sum = _mm_add_epi32(_sum, _mm_unpacklo_epi16(_sl, _sh));

                    tmpptr += 4;
                    kptr0 += 4;
                }

                sum = _mm_reduce_add_epi32(_sum);
            }

            int j = 0;
            for (; j < nn1; j++)
            {
                signed char val = tmpptr[0];
                signed char w = kptr0[0];

                sum += val * w;

                tmpptr += 1;
                kptr0 += 1;
            }

            outptr0[0] = sum;
            outptr0 += 1;
        }
#else  // __SSE2__
        for (; i < size; i++)
        {
            const signed char* tmpptr = tmp.channel(i);
            const signed char* kptr0 = kernel.channel(p);

            int nn1 = inch * maxk;

            int sum = 0;
            int j = 0;
            for (; j < nn1; j++)
            {
                signed char val = tmpptr[0];
                signed char w = kptr0[0];

                sum += val * w;

                tmpptr += 1;
                kptr0 += 1;
            }

            outptr0[0] = sum;
            outptr0 += 1;
        }
#endif // __SSE2__
    }
}